

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_filename_encoding.c
# Opt level: O3

void test_pax_filename_encoding_KOI8R_BINARY(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a;
  archive_entry *entry;
  size_t used;
  char buff [4096];
  size_t local_1030;
  undefined1 local_1028 [512];
  undefined1 local_e28 [21];
  undefined1 local_e13 [3563];
  
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 != (char *)0x0) {
    a = (archive_conflict *)archive_write_new();
    iVar1 = archive_write_set_format_pax((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'ț',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_pax(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options((archive *)a,"hdrcharset=BINARY");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'Ȟ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_options(a, \"hdrcharset=BINARY\")",(void *)0x0);
    iVar1 = archive_write_open_memory((archive *)a,local_1028,0x1000,&local_1030);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'Ƞ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    entry = archive_entry_new2(a);
    archive_entry_set_pathname(entry,anon_var_dwarf_46084);
    archive_entry_set_filetype(entry,0x8000);
    archive_entry_set_size(entry,0);
    iVar1 = archive_write_header((archive *)a,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'Ȧ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(entry);
    iVar1 = archive_write_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'Ȩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'ȫ',local_e28,"buff + 512","21 hdrcharset=BINARY\n",
                        "\"21 hdrcharset=BINARY\\x0A\"",0x15,"21",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'Ȯ',local_e13,"buff + 512+21",anon_var_dwarf_4c4b5,
                        "\"12 path=\\xD0\\xD2\\xC9\\x0A\"",0xc,"12",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                 ,L'Ȗ');
  test_skipping("KOI8-R locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_pax_filename_encoding_KOI8R_BINARY)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "ru_RU.KOI8-R")) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_pax(a));
	/* BINARY mode should be accepted. */
	assertEqualInt(ARCHIVE_OK,
	    archive_write_set_options(a, "hdrcharset=BINARY"));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	archive_entry_set_pathname(entry, "\xD0\xD2\xC9");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* "hdrcharset=BINARY" pax attribute should be written. */
	assertEqualMem(buff + 512, "21 hdrcharset=BINARY\x0A", 21);
	/* Above three characters in KOI8-R should not translate to any
	 * character-set. */
	assertEqualMem(buff + 512+21, "12 path=\xD0\xD2\xC9\x0A", 12);
}